

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::PiecewiseConstant1D,pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>>
::emplace_back<pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
           *this,span<const_float> *args,float *args_1,float *args_2,
          polymorphic_allocator<std::byte> *args_3)

{
  float *in_RCX;
  float *in_RDX;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  *in_RSI;
  PiecewiseConstant1D *in_RDI;
  polymorphic_allocator<std::byte> *in_R8;
  polymorphic_allocator<pbrt::PiecewiseConstant1D> *unaff_retaddr;
  PiecewiseConstant1D *p;
  
  p = in_RDI;
  if ((in_RDI->func).nAlloc == (in_RDI->func).nStored) {
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::reserve(in_RSI,(size_t)in_RDX);
  }
  pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>::
  construct<pbrt::PiecewiseConstant1D,pstd::span<float_const>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (unaff_retaddr,p,(span<const_float> *)in_RSI,in_RDX,in_RCX,in_R8);
  (in_RDI->func).nStored = (in_RDI->func).nStored + 1;
  return;
}

Assistant:

void emplace_back(Args &&...args) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::forward<Args>(args)...);
        ++nStored;
    }